

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_rawget(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  StkId pTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  TValue *pTVar8;
  ulong uVar9;
  StkId pTVar10;
  ulong uVar11;
  StkId t;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  luaL_checktype(L,1,5);
  luaL_checkany(L,2);
  auVar6 = _DAT_00115030;
  auVar5 = _DAT_00115020;
  auVar4 = _DAT_00115010;
  pTVar2 = L->top;
  pTVar3 = L->base;
  pTVar1 = pTVar3 + 2;
  if (pTVar2 < pTVar1) {
    pTVar10 = pTVar2 + 1;
    if (pTVar2 + 1 < pTVar1) {
      pTVar10 = pTVar1;
    }
    uVar9 = (long)&pTVar10->value + ~(ulong)pTVar2;
    auVar15._8_4_ = (int)uVar9;
    auVar15._0_8_ = uVar9;
    auVar15._12_4_ = (int)(uVar9 >> 0x20);
    auVar12._0_8_ = uVar9 >> 4;
    auVar12._8_8_ = auVar15._8_8_ >> 4;
    piVar7 = &pTVar2[3].tt;
    uVar11 = 0;
    auVar12 = auVar12 ^ _DAT_00115030;
    do {
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar15 = (auVar14 | auVar5) ^ auVar6;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        piVar7[-0xc] = 0;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        piVar7[-8] = 0;
      }
      auVar15 = (auVar14 | auVar4) ^ auVar6;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar15._0_4_ <= auVar12._0_4_)) {
        piVar7[-4] = 0;
        *piVar7 = 0;
      }
      uVar11 = uVar11 + 4;
      piVar7 = piVar7 + 0x10;
    } while (((uVar9 >> 4) + 4 & 0xfffffffffffffffc) != uVar11);
  }
  L->top = pTVar1;
  pTVar8 = luaH_get(&((pTVar3->value).gc)->h,pTVar3 + 1);
  pTVar3[1].value = pTVar8->value;
  pTVar3[1].tt = pTVar8->tt;
  return 1;
}

Assistant:

static int luaB_rawget(lua_State*L){
luaL_checktype(L,1,5);
luaL_checkany(L,2);
lua_settop(L,2);
lua_rawget(L,1);
return 1;
}